

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall
QAbstractItemView::inputMethodEvent(QAbstractItemView *this,QInputMethodEvent *event)

{
  QAbstractItemViewPrivate *this_00;
  long lVar1;
  long lVar2;
  Data *pDVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  FocusPolicy FVar7;
  QEditorInfo *pQVar8;
  QAbstractItemViewPrivate *pQVar9;
  QAbstractItemViewPrivate *this_01;
  QObject *pQVar10;
  QWidget *editor;
  long in_FS_OFFSET;
  QModelIndex local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  lVar1 = *(long *)(event + 0x20);
  lVar2 = *(long *)(event + 0x38);
  currentIndex(&local_50,this);
  pQVar8 = QAbstractItemViewPrivate::editorForIndex(this_00,&local_50);
  pDVar3 = (pQVar8->widget).wp.d;
  if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
    editor = (QWidget *)0x0;
  }
  else {
    editor = (QWidget *)(pQVar8->widget).wp.value;
  }
  if (editor == (QWidget *)0x0) {
    if (lVar1 != 0) {
      this_00->waitForIMCommit = true;
      bVar5 = true;
      bVar4 = true;
      goto LAB_00540cee;
    }
    if (lVar2 != 0) goto LAB_00540cde;
    event[0xc] = (QInputMethodEvent)0x0;
  }
  else {
    if (this_00->waitForIMCommit != true) {
LAB_00540cde:
      bVar4 = true;
      bVar5 = false;
      goto LAB_00540cee;
    }
    if (lVar2 == 0 && lVar1 != 0) {
      QCoreApplication::sendEvent(&editor->super_QObject,(QEvent *)event);
    }
    else {
      this_00->waitForIMCommit = false;
      QCoreApplication::sendEvent(&editor->super_QObject,(QEvent *)event);
      if (lVar2 == 0) {
        currentIndex(&local_50,this);
        this_01 = (QAbstractItemViewPrivate *)this;
        pQVar9 = (QAbstractItemViewPrivate *)(**(code **)(*(long *)this + 0x208))(this,&local_50);
        if (pQVar9 != (QAbstractItemViewPrivate *)0x0) {
          currentIndex(&local_50,this);
          (**(code **)(*(long *)&(pQVar9->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                                 super_QWidgetPrivate + 0x80))(pQVar9,editor,&local_50);
          this_01 = pQVar9;
        }
        QAbstractItemViewPrivate::selectAllInEditor(this_01,editor);
      }
      FVar7 = QWidget::focusPolicy(editor);
      if (FVar7 != NoFocus) {
        QWidget::setFocus(editor,OtherFocusReason);
      }
    }
  }
  bVar5 = false;
  bVar4 = false;
LAB_00540cee:
  if (bVar4) {
    currentIndex(&local_50,this);
    cVar6 = (**(code **)(*(long *)this + 0x2e0))(this,&local_50,0x10,event);
    if (cVar6 == '\0') {
      this_00->waitForIMCommit = false;
      if (lVar2 != 0) {
        (**(code **)(*(long *)this + 0x1d8))(this,event + 0x28);
      }
      event[0xc] = (QInputMethodEvent)0x0;
    }
    else if (bVar5) {
      currentIndex(&local_50,this);
      pQVar8 = QAbstractItemViewPrivate::editorForIndex(this_00,&local_50);
      pDVar3 = (pQVar8->widget).wp.d;
      if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
        pQVar10 = (QObject *)0x0;
      }
      else {
        pQVar10 = (pQVar8->widget).wp.value;
      }
      if (pQVar10 != (QObject *)0x0) {
        QCoreApplication::sendEvent(pQVar10,(QEvent *)event);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::inputMethodEvent(QInputMethodEvent *event)
{
    Q_D(QAbstractItemView);
    // When QAbstractItemView::AnyKeyPressed is used, a new IM composition might
    // start before the editor widget acquires focus. Changing focus would interrupt
    // the composition, so we keep focus on the view until that first composition
    // is complete, and pass QInputMethoEvents on to the editor widget so that the
    // user gets the expected feedback. See also inputMethodQuery, which redirects
    // calls to the editor widget during that period.
    bool forwardEventToEditor = false;
    const bool commit = !event->commitString().isEmpty();
    const bool preediting = !event->preeditString().isEmpty();
    if (QWidget *currentEditor = d->editorForIndex(currentIndex()).widget) {
        if (d->waitForIMCommit) {
            if (commit || !preediting) {
                // commit or cancel
                d->waitForIMCommit = false;
                QApplication::sendEvent(currentEditor, event);
                if (!commit) {
                    QAbstractItemDelegate *delegate = itemDelegateForIndex(currentIndex());
                    if (delegate)
                        delegate->setEditorData(currentEditor, currentIndex());
                    d->selectAllInEditor(currentEditor);
                }
                if (currentEditor->focusPolicy() != Qt::NoFocus)
                    currentEditor->setFocus();
            } else {
                // more pre-editing
                QApplication::sendEvent(currentEditor, event);
            }
            return;
        }
    } else if (preediting) {
        // don't set focus when the editor opens
        d->waitForIMCommit = true;
        // but pass preedit on to editor
        forwardEventToEditor = true;
    } else if (!commit) {
        event->ignore();
        return;
    }
    if (!edit(currentIndex(), AnyKeyPressed, event)) {
        d->waitForIMCommit = false;
        if (commit)
            keyboardSearch(event->commitString());
        event->ignore();
    } else if (QWidget *currentEditor; forwardEventToEditor
               && (currentEditor = d->editorForIndex(currentIndex()).widget)) {
        QApplication::sendEvent(currentEditor, event);
    }
}